

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::DenseSupportVectors::DenseSupportVectors
          (DenseSupportVectors *this,DenseSupportVectors *from)

{
  ulong uVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__DenseSupportVectors_0048ed68;
  (this->vectors_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->vectors_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->vectors_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->vectors_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::DenseVector>::TypeHandler>
            (&(this->vectors_).super_RepeatedPtrFieldBase,
             &(from->vectors_).super_RepeatedPtrFieldBase);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

DenseSupportVectors::DenseSupportVectors(const DenseSupportVectors& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      vectors_(from.vectors_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.DenseSupportVectors)
}